

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_1::BasicResetCase::BasicResetCase
          (BasicResetCase *this,EglTestContext *eglTestCtx,char *name,char *description,
          Params *params)

{
  Params local_80;
  
  RobustnessTestCase::Params::Params(&local_80,params);
  ContextResetCase::ContextResetCase
            (&this->super_ContextResetCase,eglTestCtx,name,description,&local_80);
  RobustnessTestCase::Params::~Params(&local_80);
  (this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__RobustnessTestCase_003d8ca0;
  return;
}

Assistant:

BasicResetCase (EglTestContext& eglTestCtx, const char* name, const char* description, Params params)
		: ContextResetCase (eglTestCtx, name, description, params) {}